

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O3

void __thiscall
xray_re::xr_ogf::bone_motion_io::insert_key(bone_motion_io *this,float time,ogf_key_qr *value)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  dmatrix xform;
  undefined1 local_d8 [16];
  double local_c8 [2];
  anon_union_32_2_77b31271_for__quaternion<double>_1 local_b8;
  _matrix<double> local_98;
  
  uVar1._0_2_ = value->x;
  uVar1._2_2_ = value->y;
  auVar4 = pshuflw(ZEXT416(uVar1),ZEXT416(uVar1),0x60);
  local_b8.field_0.x = (double)(auVar4._0_4_ >> 0x10) * 3.051850947599719e-05;
  local_b8.field_0.y = (double)(auVar4._4_4_ >> 0x10) * 3.051850947599719e-05;
  uVar2._0_2_ = value->z;
  uVar2._2_2_ = value->w;
  auVar4 = pshuflw(ZEXT416(uVar2),ZEXT416(uVar2),0x60);
  local_b8.field_0.z = (double)(auVar4._0_4_ >> 0x10) * 3.051850947599719e-05;
  local_b8.field_0.w = (double)(auVar4._4_4_ >> 0x10) * 3.051850947599719e-05;
  local_d8._0_8_ = 0.0;
  local_d8._8_8_ = 0.0;
  local_c8[0] = 0.0;
  _matrix<double>::mk_xform
            (&local_98,(_quaternion<double> *)&local_b8.field_0,(_vector3<double> *)local_d8);
  _matrix<double>::get_hpb(&local_98,(double *)(local_d8 + 8),(double *)local_d8,local_c8);
  uVar3 = local_d8._0_8_;
  local_d8._0_8_ = local_d8._0_8_ ^ 0x8000000000000000;
  local_d8._8_8_ = local_d8._8_8_ ^ 0x8000000000000000;
  local_c8[0] = -local_c8[0];
  xr_envelope::insert_key((this->super_xr_bone_motion).m_envelopes[4],time,(float)-(double)uVar3);
  xr_envelope::insert_key
            ((this->super_xr_bone_motion).m_envelopes[3],time,(float)(double)local_d8._8_8_);
  xr_envelope::insert_key((this->super_xr_bone_motion).m_envelopes[5],time,(float)local_c8[0]);
  return;
}

Assistant:

void xr_ogf::bone_motion_io::insert_key(float time, const ogf_key_qr* value)
{
	dquaternion q;
	value->dequantize(q);
	dmatrix xform;
	xform.rotation(q);
	dvector3 r;
	xform.get_xyz_i(r);
	m_envelopes[4]->insert_key(time, float(r.x));
	m_envelopes[3]->insert_key(time, float(r.y));
	m_envelopes[5]->insert_key(time, float(r.z));
}